

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

void ThreadContext::ProbeCurrentStack(size_t size,ScriptContext *scriptContext)

{
  ThreadContext *pTVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ThreadContext *pTVar5;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x6e7,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar3) goto LAB_00710f56;
    *puVar4 = 0;
  }
  pTVar1 = scriptContext->threadContext;
  pTVar5 = GetContextForCurrentThread();
  if (pTVar1 != pTVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x6e8,"(scriptContext->GetThreadContext() == GetContextForCurrentThread())",
                       "scriptContext->GetThreadContext() == GetContextForCurrentThread()");
    if (!bVar3) {
LAB_00710f56:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  ProbeStack(scriptContext->threadContext,size,scriptContext,(PVOID)0x0);
  return;
}

Assistant:

void
ThreadContext::ProbeCurrentStack(size_t size, Js::ScriptContext *scriptContext)
{
    Assert(scriptContext != nullptr);
    Assert(scriptContext->GetThreadContext() == GetContextForCurrentThread());
    scriptContext->GetThreadContext()->ProbeStack(size, scriptContext);
}